

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Unpack64(int g_src,int g_dest,int g_mask,int64_t lo,int64_t hi,int64_t *icount)

{
  long in_RCX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  long in_R8;
  Integer *in_R9;
  Integer ahi;
  Integer alo;
  Integer icnt;
  Integer s;
  Integer b;
  Integer a;
  Integer in_stack_ffffffffffffffb8;
  
  pnga_unpack((long)in_EDI,(long)in_ESI,(long)in_EDX,in_stack_ffffffffffffffb8,in_RCX + 1,
              (Integer *)(in_R8 + 1));
  *in_R9 = in_stack_ffffffffffffffb8;
  return;
}

Assistant:

void GA_Unpack64(int g_src, int g_dest, int g_mask, int64_t lo, int64_t hi, int64_t *icount)
{
     Integer a = (Integer)g_src;
     Integer b = (Integer)g_dest;
     Integer s = (Integer)g_mask;
     Integer icnt;
     Integer alo = lo+1;
     Integer ahi = hi+1;
     wnga_unpack(a, b, s, alo, ahi, &icnt); 
     *icount = icnt;
}